

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall QSyntaxHighlighter::rehighlight(QSyntaxHighlighter *this)

{
  long lVar1;
  QSyntaxHighlighterPrivate *this_00;
  Data *pDVar2;
  bool bVar3;
  QObject *document;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSyntaxHighlighterPrivate **)&this->field_0x8;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this_00->doc);
  if (bVar3) {
    cursor.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    pDVar2 = (this_00->doc).wp.d;
    if ((pDVar2 == (Data *)0x0) || ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)
       ) {
      document = (QObject *)0x0;
    }
    else {
      document = (this_00->doc).wp.value;
    }
    QTextCursor::QTextCursor(&cursor,(QTextDocument *)document);
    QSyntaxHighlighterPrivate::rehighlight(this_00,&cursor,End);
    this_00->rehighlightPending = false;
    QTextCursor::~QTextCursor(&cursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::rehighlight()
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc)
        return;

    QTextCursor cursor(d->doc);
    d->rehighlight(cursor, QTextCursor::End);
    d->rehighlightPending = false; // user manually did a full rehighlight
}